

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O0

bool FastPForLib::Simple16<true>::trymefull<7u,2u,14u,1u>(uint32_t *n)

{
  uint32_t i_1;
  uint32_t min2;
  uint32_t i;
  uint32_t min1;
  uint32_t *n_local;
  
  for (i = 0; i < 7; i = i + 1) {
    if (3 < n[i]) {
      return false;
    }
  }
  i_1 = 7;
  while( true ) {
    if (0x14 < i_1) {
      return true;
    }
    if (1 < n[i_1]) break;
    i_1 = i_1 + 1;
  }
  return false;
}

Assistant:

__attribute__((pure)) static bool trymefull(const uint32_t *n) {
    const uint32_t min1 = num1;
    for (uint32_t i = 0; i < min1; i++) {
      if (n[i] >= (1U << log1))
        return false;
    }
    const uint32_t min2 = num2;
    for (uint32_t i = min1; i < min1 + min2; i++) {
      if (n[i] >= (1U << log2))
        return false;
    }
    return true;
  }